

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O2

bool __thiscall Sock::WaitMany(Sock *this,milliseconds timeout,EventsPerSock *events_per_sock)

{
  size_t sVar1;
  int iVar2;
  pointer ppVar3;
  EventsPerSock *__range1;
  byte bVar4;
  byte bVar5;
  __node_base *p_Var6;
  __node_base *p_Var7;
  long in_FS_OFFSET;
  vector<pollfd,_std::allocator<pollfd>_> pfds;
  _Vector_base<pollfd,_std::allocator<pollfd>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var6 = &(events_per_sock->_M_h)._M_before_begin;
  p_Var7 = p_Var6;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    std::vector<pollfd,_std::allocator<pollfd>_>::emplace_back<>
              ((vector<pollfd,_std::allocator<pollfd>_> *)&local_48);
    local_48._M_impl.super__Vector_impl_data._M_finish[-1].fd = *(int *)&p_Var7[1]._M_nxt[1]._M_nxt;
    sVar1 = *(size_t *)(p_Var7 + 3);
    if ((sVar1 & 1) != 0) {
      *(byte *)&local_48._M_impl.super__Vector_impl_data._M_finish[-1].events =
           (byte)local_48._M_impl.super__Vector_impl_data._M_finish[-1].events | 1;
    }
    if ((sVar1 & 2) != 0) {
      *(byte *)&local_48._M_impl.super__Vector_impl_data._M_finish[-1].events =
           (byte)local_48._M_impl.super__Vector_impl_data._M_finish[-1].events | 4;
    }
  }
  iVar2 = poll((pollfd *)local_48._M_impl.super__Vector_impl_data._M_start,
               (long)local_48._M_impl.super__Vector_impl_data._M_finish -
               (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3,(int)timeout.__r);
  if (iVar2 != -1) {
    ppVar3 = local_48._M_impl.super__Vector_impl_data._M_start;
    if ((long)local_48._M_impl.super__Vector_impl_data._M_finish -
        (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3 !=
        (events_per_sock->_M_h)._M_element_count) {
      __assert_fail("pfds.size() == events_per_sock.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/sock.cpp"
                    ,0xb3,
                    "virtual bool Sock::WaitMany(std::chrono::milliseconds, EventsPerSock &) const")
      ;
    }
    while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
      if (*(int *)&p_Var6[1]._M_nxt[1]._M_nxt != ((pollfd *)ppVar3)->fd) {
        __assert_fail("sock->m_socket == static_cast<SOCKET>(pfds[i].fd)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/sock.cpp"
                      ,0xb6,
                      "virtual bool Sock::WaitMany(std::chrono::milliseconds, EventsPerSock &) const"
                     );
      }
      *(undefined1 *)((long)(p_Var6 + 3) + 1) = 0;
      bVar4 = (byte)((pollfd *)ppVar3)->revents;
      bVar5 = bVar4 >> 1 & 2 | bVar4 & 1;
      bVar4 = bVar5 + 4;
      if ((((pollfd *)ppVar3)->revents & 0x18U) == 0) {
        bVar4 = bVar5;
      }
      *(byte *)((long)(p_Var6 + 3) + 1) = bVar4;
      ppVar3 = (pointer)((pollfd *)ppVar3 + 1);
    }
  }
  std::_Vector_base<pollfd,_std::allocator<pollfd>_>::~_Vector_base(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar2 != -1;
  }
  __stack_chk_fail();
}

Assistant:

bool Sock::WaitMany(std::chrono::milliseconds timeout, EventsPerSock& events_per_sock) const
{
#ifdef USE_POLL
    std::vector<pollfd> pfds;
    for (const auto& [sock, events] : events_per_sock) {
        pfds.emplace_back();
        auto& pfd = pfds.back();
        pfd.fd = sock->m_socket;
        if (events.requested & RECV) {
            pfd.events |= POLLIN;
        }
        if (events.requested & SEND) {
            pfd.events |= POLLOUT;
        }
    }

    if (poll(pfds.data(), pfds.size(), count_milliseconds(timeout)) == SOCKET_ERROR) {
        return false;
    }

    assert(pfds.size() == events_per_sock.size());
    size_t i{0};
    for (auto& [sock, events] : events_per_sock) {
        assert(sock->m_socket == static_cast<SOCKET>(pfds[i].fd));
        events.occurred = 0;
        if (pfds[i].revents & POLLIN) {
            events.occurred |= RECV;
        }
        if (pfds[i].revents & POLLOUT) {
            events.occurred |= SEND;
        }
        if (pfds[i].revents & (POLLERR | POLLHUP)) {
            events.occurred |= ERR;
        }
        ++i;
    }

    return true;
#else
    fd_set recv;
    fd_set send;
    fd_set err;
    FD_ZERO(&recv);
    FD_ZERO(&send);
    FD_ZERO(&err);
    SOCKET socket_max{0};

    for (const auto& [sock, events] : events_per_sock) {
        if (!sock->IsSelectable()) {
            return false;
        }
        const auto& s = sock->m_socket;
        if (events.requested & RECV) {
            FD_SET(s, &recv);
        }
        if (events.requested & SEND) {
            FD_SET(s, &send);
        }
        FD_SET(s, &err);
        socket_max = std::max(socket_max, s);
    }

    timeval tv = MillisToTimeval(timeout);

    if (select(socket_max + 1, &recv, &send, &err, &tv) == SOCKET_ERROR) {
        return false;
    }

    for (auto& [sock, events] : events_per_sock) {
        const auto& s = sock->m_socket;
        events.occurred = 0;
        if (FD_ISSET(s, &recv)) {
            events.occurred |= RECV;
        }
        if (FD_ISSET(s, &send)) {
            events.occurred |= SEND;
        }
        if (FD_ISSET(s, &err)) {
            events.occurred |= ERR;
        }
    }

    return true;
#endif /* USE_POLL */
}